

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O2

int nni_pipe_alloc_dialer(void **datap,nni_dialer *d)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  nni_pipe *local_18;
  nni_pipe *p;
  
  local_18 = (nni_pipe *)CONCAT44(in_register_00000004,in_EAX);
  iVar1 = pipe_create(&local_18,d->d_sock,d->d_tran,d,(nni_listener *)0x0);
  if (iVar1 == 0) {
    *datap = local_18->p_tran_data;
  }
  return iVar1;
}

Assistant:

int
nni_pipe_alloc_dialer(void **datap, nni_dialer *d)
{
	int          rv;
	nni_sp_tran *tran = d->d_tran;
	nni_sock    *s    = d->d_sock;
	nni_pipe    *p;

	if ((rv = pipe_create(&p, s, tran, d, NULL)) != 0) {
		return (rv);
	}
	*datap = p->p_tran_data;
	return (0);
}